

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O1

bool __thiscall
QPDF::pipeForeignStreamData
          (QPDF *this,shared_ptr<QPDF::ForeignStreamData> *foreign,Pipeline *pipeline,
          bool suppress_warnings,bool will_retry)

{
  element_type *peVar1;
  QPDFObjGen og;
  qpdf_offset_t offset;
  size_t length;
  bool bVar2;
  QPDFObjectHandle local_60;
  shared_ptr<InputSource> local_50;
  shared_ptr<QPDF::EncryptionParameters> local_40;
  
  peVar1 = (foreign->super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_40.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar1->encp).super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_40.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (peVar1->encp).super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_40.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_40.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_40.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  peVar1 = (foreign->super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_50.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar1->file).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_50.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (peVar1->file).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_50.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_50.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_50.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_50.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_50.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  peVar1 = (foreign->super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  og = peVar1->foreign_og;
  offset = peVar1->offset;
  length = peVar1->length;
  local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar1->local_dict).super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (peVar1->local_dict).super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  bVar2 = pipeStreamData(&local_40,&local_50,this,og,offset,length,&local_60,
                         ((foreign->
                          super___shared_ptr<QPDF::ForeignStreamData,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->is_root_metadata,pipeline,suppress_warnings,will_retry);
  if (local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_50.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_40.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return bVar2;
}

Assistant:

bool
QPDF::pipeForeignStreamData(
    std::shared_ptr<ForeignStreamData> foreign,
    Pipeline* pipeline,
    bool suppress_warnings,
    bool will_retry)
{
    if (foreign->encp->encrypted) {
        QTC::TC("qpdf", "QPDF pipe foreign encrypted stream");
    }
    return pipeStreamData(
        foreign->encp,
        foreign->file,
        *this,
        foreign->foreign_og,
        foreign->offset,
        foreign->length,
        foreign->local_dict,
        foreign->is_root_metadata,
        pipeline,
        suppress_warnings,
        will_retry);
}